

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_vmsumshs_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  int32_t iVar1;
  int64_t t;
  int sat;
  int i;
  int32_t prod [8];
  ppc_avr_t *c_local;
  ppc_avr_t *b_local;
  ppc_avr_t *a_local;
  ppc_avr_t *r_local;
  CPUPPCState_conflict2 *env_local;
  
  t._0_4_ = 0;
  for (t._4_4_ = 0; t._4_4_ < 8; t._4_4_ = t._4_4_ + 1) {
    (&sat)[(int)t._4_4_] = (int)a->s16[(int)t._4_4_] * (int)b->s16[(int)t._4_4_];
  }
  for (t._4_4_ = 3; -1 < (int)t._4_4_; t._4_4_ = t._4_4_ + -1) {
    iVar1 = cvtsdsw((long)c->s32[(int)t._4_4_] + (long)(&sat)[(int)(t._4_4_ << 1)] +
                    (long)(&sat)[(int)(t._4_4_ * 2 + 1)],(int *)&t);
    r->s32[(int)t._4_4_] = iVar1;
  }
  if ((int)t != 0) {
    set_vscr_sat(env);
  }
  return;
}

Assistant:

void helper_vmsumshs(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    int32_t prod[8];
    int i;
    int sat = 0;

    for (i = 0; i < ARRAY_SIZE(r->s16); i++) {
        prod[i] = (int32_t)a->s16[i] * b->s16[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        int64_t t = (int64_t)c->s32[i] + prod[2 * i] + prod[2 * i + 1];

        r->u32[i] = cvtsdsw(t, &sat);
    }

    if (sat) {
        set_vscr_sat(env);
    }
}